

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(WordEmbedding *a,WordEmbedding *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  int iVar4;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  psVar1 = (a->language_).ptr_;
  psVar2 = (b->language_).ptr_;
  sVar3 = psVar1->_M_string_length;
  if ((sVar3 == psVar2->_M_string_length) &&
     ((sVar3 == 0 ||
      (iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar4 == 0)))) {
    psVar1 = (a->modelparameterdata_).ptr_;
    sVar3 = psVar1->_M_string_length;
    psVar2 = (b->modelparameterdata_).ptr_;
    if ((sVar3 == psVar2->_M_string_length) &&
       ((sVar3 == 0 ||
        (iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar4 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint32 WordEmbedding::revision() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CoreMLModels.WordEmbedding.revision)
  return revision_;
}